

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O0

void Gia_IsoAssignOneClass(Gia_IsoMan_t *p,int fVerbose)

{
  Vec_Int_t *p_00;
  int *piVar1;
  int nSizeNew;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int Shrink;
  int nSize;
  int iBegin;
  int iBegin0;
  int k;
  int i;
  int fVerbose_local;
  Gia_IsoMan_t *p_local;
  
  iVar2 = Vec_IntSize(p->vClasses);
  if (iVar2 < 1) {
    __assert_fail("Vec_IntSize(p->vClasses) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIso.c"
                  ,0x24f,"void Gia_IsoAssignOneClass(Gia_IsoMan_t *, int)");
  }
  p_00 = p->vClasses;
  iVar2 = Vec_IntSize(p->vClasses);
  iVar2 = Vec_IntEntry(p_00,iVar2 + -2);
  iBegin0 = Vec_IntSize(p->vClasses);
  do {
    nSizeNew = iBegin0;
    iBegin0 = nSizeNew + -2;
    if (iBegin0 < 0) break;
    iVar3 = Vec_IntEntry(p->vClasses,iBegin0);
    piVar1 = p->pLevels;
    uVar4 = Gia_IsoGetItem(p,iVar3);
    iVar3 = piVar1[uVar4];
    piVar1 = p->pLevels;
    uVar4 = Gia_IsoGetItem(p,iVar2);
  } while (iVar3 == piVar1[uVar4]);
  iBegin0 = nSizeNew;
  if (nSizeNew < 0) {
    __assert_fail("i >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIso.c"
                  ,600,"void Gia_IsoAssignOneClass(Gia_IsoMan_t *, int)");
  }
  do {
    iVar2 = Vec_IntSize(p->vClasses);
    if (iVar2 <= iBegin0) {
      Vec_IntShrink(p->vClasses,nSizeNew);
      return;
    }
    iVar2 = Vec_IntEntry(p->vClasses,iBegin0);
    uVar4 = Vec_IntEntry(p->vClasses,iBegin0 + 1);
    for (iBegin = 0; iBegin < (int)uVar4; iBegin = iBegin + 1) {
      piVar1 = p->pUniques;
      uVar5 = Gia_IsoGetItem(p,iVar2 + iBegin);
      if (piVar1[uVar5] != 0) {
        __assert_fail("p->pUniques[Gia_IsoGetItem(p, iBegin+k)] == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIso.c"
                      ,0x260,"void Gia_IsoAssignOneClass(Gia_IsoMan_t *, int)");
      }
      iVar3 = p->nUniques;
      p->nUniques = iVar3 + 1;
      piVar1 = p->pUniques;
      uVar5 = Gia_IsoGetItem(p,iVar2 + iBegin);
      piVar1[uVar5] = iVar3;
      p->nSingles = p->nSingles + 1;
      p->nEntries = p->nEntries + -1;
    }
    if (fVerbose != 0) {
      piVar1 = p->pLevels;
      uVar5 = Gia_IsoGetItem(p,iVar2);
      printf("Broke ties in class of size %d at level %d.\n",(ulong)uVar4,(ulong)(uint)piVar1[uVar5]
            );
    }
    iBegin0 = iBegin0 + 2;
  } while( true );
}

Assistant:

void Gia_IsoAssignOneClass( Gia_IsoMan_t * p, int fVerbose )
{
    int i, k, iBegin0, iBegin, nSize, Shrink;
    // find the classes with the highest level
    assert( Vec_IntSize(p->vClasses) > 0 );
    iBegin0 = Vec_IntEntry( p->vClasses, Vec_IntSize(p->vClasses) - 2 );
    for ( i = Vec_IntSize(p->vClasses) - 2; i >= 0; i -= 2 )
    {
        iBegin = Vec_IntEntry( p->vClasses, i );
        if ( p->pLevels[Gia_IsoGetItem(p, iBegin)] != p->pLevels[Gia_IsoGetItem(p, iBegin0)] )
            break;
    }
    i += 2;
    assert( i >= 0 );
    // assign all classes starting with this one
    for ( Shrink = i; i < Vec_IntSize(p->vClasses); i += 2 )
    {
        iBegin = Vec_IntEntry( p->vClasses, i );
        nSize  = Vec_IntEntry( p->vClasses, i + 1 );
        for ( k = 0; k < nSize; k++ )
        {
            assert( p->pUniques[Gia_IsoGetItem(p, iBegin+k)] == 0 );
            p->pUniques[Gia_IsoGetItem(p, iBegin+k)] = p->nUniques++;
//            Gia_ManObj(p->pGia, Gia_IsoGetItem(p, iBegin+k))->Value += s_256Primes[0]; ///  new addition!!!
            p->nSingles++;
            p->nEntries--;
        }
        if ( fVerbose )
            printf( "Broke ties in class of size %d at level %d.\n", nSize, p->pLevels[Gia_IsoGetItem(p, iBegin)] );
    }
    Vec_IntShrink( p->vClasses, Shrink );
}